

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O1

bool __thiscall
ADS::Graph<unsigned_int>::isConnected(Graph<unsigned_int> *this,bool bStronglyConnected)

{
  bool bVar1;
  Graph<unsigned_int> *this_00;
  Vertex<unsigned_int> *pVVar2;
  undefined7 in_register_00000031;
  ulong uVar3;
  ulong uVar4;
  bool *pVisited;
  bool *local_30;
  
  if (((int)CONCAT71(in_register_00000031,bStronglyConnected) == 0) && (this->_bDirected == true)) {
    this_00 = getUndirectedGraph(this);
    bVar1 = isConnected(this_00,false);
    (*this_00->_vptr_Graph[1])(this_00);
  }
  else {
    local_30 = (bool *)allocateArray(this->_uiNVertexes,1);
    bVar1 = true;
    if ((this->_vertices)._uiLen != 0) {
      uVar4 = 0;
      do {
        pVVar2 = DArray<ADS::Vertex<unsigned_int>_*>::get(&this->_vertices,(uint)uVar4);
        if (pVVar2 != (Vertex<unsigned_int> *)0x0) {
          local_30[uVar4] = true;
          traverse(this,pVVar2,local_30);
          if (this->_uiNVertexes != 0) {
            uVar3 = 0;
            do {
              pVVar2 = DArray<ADS::Vertex<unsigned_int>_*>::get(&this->_vertices,(uint)uVar3);
              if ((pVVar2 != (Vertex<unsigned_int> *)0x0) && (local_30[uVar3] != true)) {
                bVar1 = false;
                goto LAB_0010493e;
              }
              uVar3 = uVar3 + 1;
            } while (uVar3 < this->_uiNVertexes);
          }
        }
        if (this->_bDirected != true) break;
        setArray(0,local_30,this->_uiNVertexes,1);
        uVar4 = uVar4 + 1;
      } while (uVar4 < (this->_vertices)._uiLen);
    }
LAB_0010493e:
    deallocate(&local_30);
  }
  return bVar1;
}

Assistant:

bool Graph<T>::isConnected (bool bStronglyConnected)
    {
        if (!bStronglyConnected && isDirected()) {
            /* Get the underlying undirected graph and checks if
               that is connected */
            Graph *pGraph = getUndirectedGraph();
            bool bRet = pGraph->isConnected (bStronglyConnected);
            delete pGraph;
            return bRet;
        }

        /* Allocated array initializes all the elements to 0x0 */
        bool *pVisited = (bool *) allocateArray (_uiNVertexes, sizeof (bool));

        /* For each vertex */
        Vertex<T> *pVertex = NULL;
        unsigned int uiVertexKey = 0;
        for (; uiVertexKey < _vertices.size(); uiVertexKey++) {
            if ((pVertex = _vertices.get (uiVertexKey)) != NULL) {
                pVisited[uiVertexKey] = true;
                traverse (pVertex, pVisited);

                /* Checks whether all the vertices were visited */
                for (unsigned int i = 0; i < _uiNVertexes; i++)
                    if ((_vertices.get (i) != NULL) && !pVisited[i]) {
                        /* the vertex of key "i" exists and it was not visited */
                        deallocate ((void**)&pVisited);
                        return false;
                    }
            }
            if (!isDirected())
                /* if the graph is undirected, having 1 connected node is
                   a sufficient condition for the graph to be strongly connected
                   (and therefore not to be weakly connected as well */
                break;
            /* Reset array of visited nodes */
            setArray ((int)false, pVisited, _uiNVertexes, sizeof (bool));
        }

        deallocate ((void**)&pVisited);
        return true;
    }